

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile_next.c
# Opt level: O0

int next_updateheader(t_soundfile *sf,size_t nframes)

{
  uint32_t uVar1;
  ssize_t sVar2;
  ulong local_30;
  size_t datasize;
  size_t sStack_20;
  int swap;
  size_t nframes_local;
  t_soundfile *sf_local;
  
  sStack_20 = nframes;
  nframes_local = (size_t)sf;
  datasize._4_4_ = soundfile_needsbyteswap(sf);
  local_30 = sStack_20 * (long)*(int *)(nframes_local + 0x2c);
  if (0xffffffff < local_30) {
    local_30 = 0xffffffff;
  }
  uVar1 = swap4((uint32_t)local_30,datasize._4_4_);
  local_30 = (ulong)uVar1;
  sVar2 = fd_write(*(int *)nframes_local,8,&local_30,4);
  sf_local._4_4_ = (uint)(3 < sVar2);
  return sf_local._4_4_;
}

Assistant:

static int next_updateheader(t_soundfile *sf, size_t nframes)
{
    int swap = soundfile_needsbyteswap(sf);
    size_t datasize = nframes * sf->sf_bytesperframe;

    if (datasize > NEXTMAXBYTES)
        datasize = NEXT_UNKNOWN_SIZE;
    datasize = swap4(datasize, swap);
    if (fd_write(sf->sf_fd, 8, &datasize, 4) < 4)
        return 0;

#ifdef DEBUG_SOUNDFILE
    datasize = swap4(datasize, swap);
    post("next %.4s (%s)", (sf->sf_bigendian ? ".snd" : "dns."),
        (sf->sf_bigendian ? "big" : "little"));
    if (datasize == NEXT_UNKNOWN_SIZE)
        post("  data length -1");
    else
        post("  data length %d", datasize);
#endif

    return 1;
}